

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3Fts3DoclistPrev
               (int bDescIdx,char *aDoclist,int nDoclist,char **ppIter,sqlite3_int64 *piDocid,
               int *pnList,u8 *pbEof)

{
  byte *pbVar1;
  char cVar2;
  sqlite3_int64 sVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  char *pBuf;
  sqlite3_int64 iVal;
  char **local_50;
  int *local_48;
  char **local_40;
  sqlite3_int64 iDelta;
  
  pcVar9 = *ppIter;
  local_40 = (char **)piDocid;
  local_50 = ppIter;
  local_48 = pnList;
  if (pcVar9 == (char *)0x0) {
    pcVar9 = aDoclist + nDoclist;
    pcVar7 = (char *)0x0;
    uVar8 = -(ulong)(bDescIdx != 0) | 1;
    pBuf = (char *)0x0;
    uVar10 = 1;
    iVal = (sqlite3_int64)aDoclist;
    while (sVar3 = iVal, (ulong)iVal < pcVar9) {
      iVar6 = sqlite3Fts3GetVarint((char *)iVal,&iDelta);
      pcVar7 = (char *)(iVar6 + sVar3);
      pBuf = pBuf + uVar10 * iDelta;
      iVal = (sqlite3_int64)pcVar7;
      fts3PoslistCopy((char **)0x0,(char **)&iVal);
      for (; (uVar10 = uVar8, (ulong)iVal < pcVar9 && (*(char *)iVal == '\0')); iVal = iVal + 1) {
      }
    }
    *local_48 = (int)pcVar9 - (int)pcVar7;
    *local_50 = pcVar7;
  }
  else {
    iVar6 = (int)pcVar9;
    for (pcVar7 = pcVar9 + -2; (iVar6 = iVar6 + -1, aDoclist <= pcVar7 && (*pcVar7 < '\0'));
        pcVar7 = pcVar7 + -1) {
      pcVar9 = pcVar9 + -1;
    }
    pBuf = pcVar7 + 1;
    sqlite3Fts3GetVarint(pBuf,&iVal);
    lVar4 = -iVal;
    if (bDescIdx != 0) {
      lVar4 = iVal;
    }
    *local_40 = (char *)((long)*local_40 + lVar4);
    local_40 = local_50;
    if (pBuf == aDoclist) {
      *pbEof = '\x01';
    }
    else {
      lVar4 = -3;
      do {
        if (pcVar9 + lVar4 <= aDoclist) {
          bVar5 = 0;
          break;
        }
        bVar5 = pcVar9[lVar4];
        lVar4 = lVar4 + -1;
      } while (bVar5 == 0);
      lVar4 = lVar4 + 2;
      pcVar9 = pcVar9 + lVar4;
      for (; pBuf = pcVar7 + lVar4, aDoclist < pBuf; lVar4 = lVar4 + -1) {
        pbVar1 = (byte *)(pcVar9 + -2);
        if (bVar5 == 0 && (*pbVar1 & 0x80) == 0) goto LAB_001a04e1;
        pcVar9 = pcVar9 + -1;
        bVar5 = *pbVar1;
      }
      if ((lVar4 < -1) && (bVar5 == 0)) {
LAB_001a04e1:
        pBuf = pcVar9;
      }
      iVar6 = iVar6 - (int)pBuf;
      do {
        iVar6 = iVar6 + -1;
        cVar2 = *pBuf;
        pBuf = pBuf + 1;
      } while (cVar2 < '\0');
      *local_48 = iVar6;
    }
  }
  *local_40 = pBuf;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3DoclistPrev(
  int bDescIdx,                   /* True if the doclist is desc */
  char *aDoclist,                 /* Pointer to entire doclist */
  int nDoclist,                   /* Length of aDoclist in bytes */
  char **ppIter,                  /* IN/OUT: Iterator pointer */
  sqlite3_int64 *piDocid,         /* IN/OUT: Docid pointer */
  int *pnList,                    /* OUT: List length pointer */
  u8 *pbEof                       /* OUT: End-of-file flag */
){
  char *p = *ppIter;

  assert( nDoclist>0 );
  assert( *pbEof==0 );
  assert( p || *piDocid==0 );
  assert( !p || (p>aDoclist && p<&aDoclist[nDoclist]) );

  if( p==0 ){
    sqlite3_int64 iDocid = 0;
    char *pNext = 0;
    char *pDocid = aDoclist;
    char *pEnd = &aDoclist[nDoclist];
    int iMul = 1;

    while( pDocid<pEnd ){
      sqlite3_int64 iDelta;
      pDocid += sqlite3Fts3GetVarint(pDocid, &iDelta);
      iDocid += (iMul * iDelta);
      pNext = pDocid;
      fts3PoslistCopy(0, &pDocid);
      while( pDocid<pEnd && *pDocid==0 ) pDocid++;
      iMul = (bDescIdx ? -1 : 1);
    }

    *pnList = (int)(pEnd - pNext);
    *ppIter = pNext;
    *piDocid = iDocid;
  }else{
    int iMul = (bDescIdx ? -1 : 1);
    sqlite3_int64 iDelta;
    fts3GetReverseVarint(&p, aDoclist, &iDelta);
    *piDocid -= (iMul * iDelta);

    if( p==aDoclist ){
      *pbEof = 1;
    }else{
      char *pSave = p;
      fts3ReversePoslist(aDoclist, &p);
      *pnList = (int)(pSave - p);
    }
    *ppIter = p;
  }
}